

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::BasicWriter<wchar_t>::write_int<unsigned_long,fmt::FormatSpec>
          (BasicWriter<wchar_t> *this,unsigned_long value,FormatSpec spec)

{
  undefined4 uVar1;
  lconv *plVar2;
  size_t sVar3;
  ulong uVar4;
  CharPtr pwVar5;
  byte bVar6;
  char *pcVar7;
  unsigned_long uVar8;
  long lVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  char in_stack_ffffffffffffffbf;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar14;
  
  uVar1 = spec._20_4_;
  uVar14 = 0;
  uVar10 = 0;
  if (((undefined1  [24])spec & (undefined1  [24])0x100000000) != (undefined1  [24])0x0) {
    bVar6 = 0x2b;
    if (((undefined1  [24])spec & (undefined1  [24])0x200000000) == (undefined1  [24])0x0) {
      bVar6 = 0x20;
    }
    uVar14 = (uint)bVar6;
    uVar10 = 1;
  }
  spec._20_4_ = uVar1;
  if ((byte)spec.type_ < 100) {
    if ((byte)spec.type_ < 0x58) {
      if (spec.type_ == '\0') goto LAB_0010db39;
      if (spec.type_ != 'B') goto code_r0x0010dcce;
    }
    else {
      if (spec.type_ == 'X') {
LAB_0010dabe:
        uVar14 = uVar10;
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          (&stack0xffffffffffffffc4)[uVar10] = 0x30;
          uVar14 = uVar10 | 2;
          (&stack0xffffffffffffffc5)[uVar10] = spec.type_;
        }
        uVar10 = 0;
        uVar8 = value;
        do {
          uVar10 = uVar10 + 1;
          bVar13 = 0xf < uVar8;
          uVar8 = uVar8 >> 4;
        } while (bVar13);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar10,&spec,&stack0xffffffffffffffc4,uVar14);
        pcVar7 = "0123456789ABCDEF";
        if (spec.type_ == 'x') {
          pcVar7 = "0123456789abcdef";
        }
        do {
          *pwVar5 = (int)pcVar7[(uint)value & 0xf];
          pwVar5 = pwVar5 + -1;
          bVar13 = 0xf < value;
          value = value >> 4;
        } while (bVar13);
        return;
      }
      if (spec.type_ != 'b') goto code_r0x0010dcce;
    }
    uVar14 = uVar10;
    if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
      (&stack0xffffffffffffffc4)[uVar10] = 0x30;
      uVar14 = uVar10 | 2;
      (&stack0xffffffffffffffc5)[uVar10] = spec.type_;
    }
    uVar10 = 0;
    uVar8 = value;
    do {
      uVar10 = uVar10 + 1;
      bVar13 = 1 < uVar8;
      uVar8 = uVar8 >> 1;
    } while (bVar13);
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>(this,uVar10,&spec,&stack0xffffffffffffffc4,uVar14);
    do {
      *pwVar5 = (uint)value & 1 | 0x30;
      pwVar5 = pwVar5 + -1;
      bVar13 = 1 < value;
      value = value >> 1;
    } while (bVar13);
  }
  else {
    if (0x6e < (byte)spec.type_) {
      if (spec.type_ == 'o') {
        if (((undefined1  [24])spec & (undefined1  [24])0x800000000) != (undefined1  [24])0x0) {
          uVar4 = (ulong)uVar10;
          uVar10 = uVar10 + 1;
          (&stack0xffffffffffffffc4)[uVar4] = 0x30;
        }
        uVar14 = 0;
        uVar8 = value;
        do {
          uVar14 = uVar14 + 1;
          bVar13 = 7 < uVar8;
          uVar8 = uVar8 >> 3;
        } while (bVar13);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar14,&spec,&stack0xffffffffffffffc4,uVar10);
        do {
          *pwVar5 = (uint)value & 7 | 0x30;
          pwVar5 = pwVar5 + -1;
          bVar13 = 7 < value;
          value = value >> 3;
        } while (bVar13);
        return;
      }
      if (spec.type_ == 'x') goto LAB_0010dabe;
code_r0x0010dcce:
      internal::report_unknown_type
                (in_stack_ffffffffffffffbf,(char *)CONCAT44(uVar14,in_stack_ffffffffffffffc0));
    }
    if (spec.type_ != 'd') {
      if (spec.type_ == 'n') {
        lVar12 = 0x3f;
        if ((value | 1) != 0) {
          for (; (value | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
          }
        }
        uVar14 = ((uint)lVar12 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
        plVar2 = localeconv();
        pcVar7 = plVar2->thousands_sep;
        sVar3 = strlen(pcVar7);
        uVar14 = uVar14 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar14]);
        pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                           (this,uVar14 + (int)sVar3 * (uVar14 / 3) + 1,&spec,
                            &stack0xffffffffffffffc4,uVar10);
        pwVar5 = pwVar5 + 1;
        uVar10 = 0;
        if (99 < value) {
          uVar8 = value;
          do {
            uVar14 = uVar10;
            value = uVar8 / 100;
            uVar4 = (ulong)(uint)(((int)uVar8 + (int)value * -100) * 2);
            pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [uVar4 + 1];
            pwVar5 = pwVar5 + -1;
            if (((uVar14 | 1) * -0x55555555 < 0x55555556) &&
               (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
              lVar9 = 0;
              lVar12 = sVar3 + 1;
              do {
                pwVar5[lVar9] = (int)pcVar7[lVar9];
                lVar12 = lVar12 + -1;
                lVar9 = lVar9 + 1;
              } while (1 < lVar12);
            }
            pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                              [uVar4];
            pwVar5 = pwVar5 + -1;
            if (((uVar14 + 2) * -0x55555555 < 0x55555556) &&
               (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
              lVar9 = 0;
              lVar12 = sVar3 + 1;
              do {
                pwVar5[lVar9] = (int)pcVar7[lVar9];
                lVar12 = lVar12 + -1;
                lVar9 = lVar9 + 1;
              } while (1 < lVar12);
            }
            bVar13 = 9999 < uVar8;
            uVar8 = value;
            uVar10 = uVar14 + 2;
          } while (bVar13);
          uVar10 = (uint)(uVar14 * -0x55555555 + 1 < 0x55555556);
        }
        if (value < 10) {
          pwVar5[-1] = (uint)value | 0x30;
          return;
        }
        uVar4 = (value & 0xffffffff) * 2;
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [(uVar4 & 0xffffffff) + 1];
        pwVar5 = pwVar5 + -1;
        if (((char)uVar10 != '\0') && (pwVar5 = pwVar5 + -sVar3, 0 < (long)sVar3)) {
          lVar9 = sVar3 + 1;
          lVar12 = 0;
          do {
            pwVar5[lVar12] = (int)pcVar7[lVar12];
            lVar9 = lVar9 + -1;
            lVar12 = lVar12 + 1;
          } while (1 < lVar9);
        }
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar4];
        return;
      }
      goto code_r0x0010dcce;
    }
LAB_0010db39:
    lVar12 = 0x3f;
    if ((value | 1) != 0) {
      for (; (value | 1) >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    uVar14 = ((uint)lVar12 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
    pwVar5 = prepare_int_buffer<fmt::FormatSpec>
                       (this,(uVar14 - (value < internal::BasicData<void>::POWERS_OF_10_64[uVar14]))
                             + 1,&spec,&stack0xffffffffffffffc4,uVar10);
    pwVar5 = pwVar5 + 1;
    uVar4 = value;
    if (99 < value) {
      do {
        value = uVar4 / 100;
        uVar11 = (ulong)(uint)((int)uVar4 + (int)value * -100);
        pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar11 * 2 + 1];
        pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                          [uVar11 * 2];
        pwVar5 = pwVar5 + -2;
        bVar13 = 9999 < uVar4;
        uVar4 = value;
      } while (bVar13);
    }
    if (value < 10) {
      pwVar5[-1] = (uint)value | 0x30;
    }
    else {
      pwVar5[-1] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [((value & 0xffffffff) * 2 & 0xffffffff) + 1];
      pwVar5[-2] = (int)"00010203040506070809101112131415161718192021222324252627282930313233343536373839404142434445464748495051525354555657585960616263646566676869707172737475767778798081828384858687888990919293949596979899"
                        [(value & 0xffffffff) * 2];
    }
  }
  return;
}

Assistant:

void BasicWriter<Char>::write_int(T value, Spec spec) {
  unsigned prefix_size = 0;
  typedef typename internal::IntTraits<T>::MainType UnsignedType;
  UnsignedType abs_value = static_cast<UnsignedType>(value);
  char prefix[4] = "";
  if (internal::is_negative(value)) {
    prefix[0] = '-';
    ++prefix_size;
    abs_value = 0 - abs_value;
  } else if (spec.flag(SIGN_FLAG)) {
    prefix[0] = spec.flag(PLUS_FLAG) ? '+' : ' ';
    ++prefix_size;
  }
  switch (spec.type()) {
  case 0: case 'd': {
    unsigned num_digits = internal::count_digits(abs_value);
    CharPtr p = prepare_int_buffer(num_digits, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0);
    break;
  }
  case 'x': case 'X': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 4) != 0);
    Char *p = get(prepare_int_buffer(
      num_digits, spec, prefix, prefix_size));
    n = abs_value;
    const char *digits = spec.type() == 'x' ?
        "0123456789abcdef" : "0123456789ABCDEF";
    do {
      *p-- = digits[n & 0xf];
    } while ((n >>= 4) != 0);
    break;
  }
  case 'b': case 'B': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG)) {
      prefix[prefix_size++] = '0';
      prefix[prefix_size++] = spec.type();
    }
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 1) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 1));
    } while ((n >>= 1) != 0);
    break;
  }
  case 'o': {
    UnsignedType n = abs_value;
    if (spec.flag(HASH_FLAG))
      prefix[prefix_size++] = '0';
    unsigned num_digits = 0;
    do {
      ++num_digits;
    } while ((n >>= 3) != 0);
    Char *p = get(prepare_int_buffer(num_digits, spec, prefix, prefix_size));
    n = abs_value;
    do {
      *p-- = static_cast<Char>('0' + (n & 7));
    } while ((n >>= 3) != 0);
    break;
  }
  case 'n': {
    unsigned num_digits = internal::count_digits(abs_value);
    fmt::StringRef sep = "";
#ifndef ANDROID
    sep = internal::thousands_sep(std::localeconv());
#endif
    unsigned size = static_cast<unsigned>(
          num_digits + sep.size() * ((num_digits - 1) / 3));
    CharPtr p = prepare_int_buffer(size, spec, prefix, prefix_size) + 1;
    internal::format_decimal(get(p), abs_value, 0, internal::ThousandsSep(sep));
    break;
  }
  default:
    internal::report_unknown_type(
      spec.type(), spec.flag(CHAR_FLAG) ? "char" : "integer");
    break;
  }
}